

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

longlong __thiscall
cmsys::SystemInformationImplementation::GetProcessId(SystemInformationImplementation *this)

{
  __pid_t _Var1;
  
  _Var1 = getpid();
  return (long)_Var1;
}

Assistant:

long long SystemInformationImplementation::GetProcessId()
{
#if defined(_WIN32)
  return GetCurrentProcessId();
#elif defined(__linux) || defined(__APPLE__) || defined(__OpenBSD__) ||       \
  defined(__FreeBSD__) || defined(__NetBSD__) || defined(__DragonFly__) ||    \
  defined(__CYGWIN__)
  return getpid();
#else
  return -1;
#endif
}